

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

int32_t tnt_schema_stosid(tnt_schema *schema_obj,char *name,uint32_t name_len)

{
  mh_int_t x;
  assoc_val **ppaVar1;
  tnt_schema_sval *space;
  undefined1 auStack_40 [4];
  mh_int_t space_slot;
  assoc_key space_key;
  mh_assoc_t *schema;
  uint32_t name_len_local;
  char *name_local;
  tnt_schema *schema_obj_local;
  
  space_key._8_8_ = schema_obj->space_hash;
  _auStack_40 = name;
  space_key.id._0_4_ = name_len;
  x = mh_assoc_find((mh_assoc_t *)space_key._8_8_,(assoc_key *)auStack_40,(void *)0x0);
  if (x == *(mh_int_t *)(space_key._8_8_ + 0x10)) {
    schema_obj_local._4_4_ = -1;
  }
  else {
    ppaVar1 = mh_assoc_node((mh_assoc_t *)space_key._8_8_,x);
    schema_obj_local._4_4_ = *(int32_t *)((long)(*ppaVar1)->data + 0xc);
  }
  return schema_obj_local._4_4_;
}

Assistant:

int32_t tnt_schema_stosid(struct tnt_schema *schema_obj, const char *name,
			  uint32_t name_len) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	struct assoc_key space_key = {name, name_len};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	const struct tnt_schema_sval *space =
		(*mh_assoc_node(schema, space_slot))->data;
	return space->number;
}